

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeColumnFromOverflow
              (VdbeCursor *pC,int iCol,int t,i64 iOffset,u32 cacheStatus,u32 colCacheCtr,Mem *pDest)

{
  byte *pbVar1;
  u8 enc;
  long lVar2;
  int iVar3;
  VdbeTxtBlbCache *pVVar4;
  i64 iVar5;
  uchar *pBuf;
  uint amt;
  
  if ((uint)t < 0x80) {
    amt = (uint)""[(uint)t];
  }
  else {
    amt = t - 0xcU >> 1;
  }
  if (pDest->db->aLimit[0] < (int)amt) {
    return 0x12;
  }
  enc = pDest->enc;
  if ((amt < 0xfa1) || (pC->pKeyInfo != (KeyInfo *)0x0)) {
    iVar3 = sqlite3VdbeMemFromBtree((pC->uc).pCursor,(u32)iOffset,amt,pDest);
    if (iVar3 != 0) {
      return iVar3;
    }
    sqlite3VdbeSerialGet((uchar *)pDest->z,t,pDest);
    iVar3 = 0;
    if ((enc == '\x01' & (byte)t) != 1) goto LAB_0014f328;
    pDest->z[amt] = '\0';
  }
  else {
    if ((pC->field_0x5 & 0x10) == 0) {
      pVVar4 = (VdbeTxtBlbCache *)sqlite3DbMallocZero(pDest->db,0x20);
      pC->pCache = pVVar4;
      if (pVVar4 == (VdbeTxtBlbCache *)0x0) {
        return 7;
      }
      pC->field_0x5 = pC->field_0x5 | 0x10;
    }
    else {
      pVVar4 = pC->pCache;
    }
    pBuf = (uchar *)pVVar4->pCValue;
    if (pBuf == (uchar *)0x0) {
LAB_0014f3d4:
      pBuf = (uchar *)sqlite3RCStrNew((ulong)(amt + 3));
      pVVar4->pCValue = (char *)pBuf;
      if (pBuf == (uchar *)0x0) {
        return 7;
      }
      iVar3 = accessPayload((pC->uc).pCursor,(u32)iOffset,amt,pBuf,0);
      if (iVar3 != 0) {
        return iVar3;
      }
      (pBuf + amt)[0] = '\0';
      (pBuf + amt)[1] = '\0';
      pBuf[(ulong)amt + 2] = '\0';
      pVVar4->iCol = iCol;
      pVVar4->cacheStatus = cacheStatus;
      pVVar4->colCacheCtr = colCacheCtr;
      iVar5 = sqlite3BtreeOffset((pC->uc).pCursor);
      pVVar4->iOffset = iVar5;
    }
    else {
      if (((pVVar4->iCol != iCol) || (pVVar4->cacheStatus != cacheStatus)) ||
         (pVVar4->colCacheCtr != colCacheCtr)) {
LAB_0014f3b6:
        if (*(ulong *)(pBuf + -8) < 2) {
          sqlite3_free(pBuf + -8);
        }
        else {
          *(ulong *)(pBuf + -8) = *(ulong *)(pBuf + -8) - 1;
        }
        goto LAB_0014f3d4;
      }
      lVar2 = pVVar4->iOffset;
      iVar5 = sqlite3BtreeOffset((pC->uc).pCursor);
      pBuf = (uchar *)pVVar4->pCValue;
      if (lVar2 != iVar5) {
        if (pBuf == (uchar *)0x0) goto LAB_0014f3d4;
        goto LAB_0014f3b6;
      }
    }
    *(long *)(pBuf + -8) = *(long *)(pBuf + -8) + 1;
    if ((t & 1U) == 0) {
      iVar3 = sqlite3VdbeMemSetStr(pDest,(char *)pBuf,(ulong)amt,'\0',sqlite3RCStrUnref);
      goto LAB_0014f328;
    }
    iVar3 = sqlite3VdbeMemSetStr(pDest,(char *)pBuf,(ulong)amt,enc,sqlite3RCStrUnref);
  }
  pbVar1 = (byte *)((long)&pDest->flags + 1);
  *pbVar1 = *pbVar1 | 2;
LAB_0014f328:
  pbVar1 = (byte *)((long)&pDest->flags + 1);
  *pbVar1 = *pbVar1 & 0xbf;
  return iVar3;
}

Assistant:

static SQLITE_NOINLINE int vdbeColumnFromOverflow(
  VdbeCursor *pC,       /* The BTree cursor from which we are reading */
  int iCol,             /* The column to read */
  int t,                /* The serial-type code for the column value */
  i64 iOffset,          /* Offset to the start of the content value */
  u32 cacheStatus,      /* Current Vdbe.cacheCtr value */
  u32 colCacheCtr,      /* Current value of the column cache counter */
  Mem *pDest            /* Store the value into this register. */
){
  int rc;
  sqlite3 *db = pDest->db;
  int encoding = pDest->enc;
  int len = sqlite3VdbeSerialTypeLen(t);
  assert( pC->eCurType==CURTYPE_BTREE );
  if( len>db->aLimit[SQLITE_LIMIT_LENGTH] ) return SQLITE_TOOBIG;
  if( len > 4000 && pC->pKeyInfo==0 ){
    /* Cache large column values that are on overflow pages using
    ** an RCStr (reference counted string) so that if they are reloaded,
    ** that do not have to be copied a second time.  The overhead of
    ** creating and managing the cache is such that this is only
    ** profitable for larger TEXT and BLOB values.
    **
    ** Only do this on table-btrees so that writes to index-btrees do not
    ** need to clear the cache.  This buys performance in the common case
    ** in exchange for generality.
    */
    VdbeTxtBlbCache *pCache;
    char *pBuf;
    if( pC->colCache==0 ){
      pC->pCache = sqlite3DbMallocZero(db, sizeof(VdbeTxtBlbCache) );
      if( pC->pCache==0 ) return SQLITE_NOMEM;
      pC->colCache = 1;
    }
    pCache = pC->pCache;
    if( pCache->pCValue==0
     || pCache->iCol!=iCol
     || pCache->cacheStatus!=cacheStatus
     || pCache->colCacheCtr!=colCacheCtr
     || pCache->iOffset!=sqlite3BtreeOffset(pC->uc.pCursor)
    ){
      if( pCache->pCValue ) sqlite3RCStrUnref(pCache->pCValue);
      pBuf = pCache->pCValue = sqlite3RCStrNew( len+3 );
      if( pBuf==0 ) return SQLITE_NOMEM;
      rc = sqlite3BtreePayload(pC->uc.pCursor, iOffset, len, pBuf);
      if( rc ) return rc;
      pBuf[len] = 0;
      pBuf[len+1] = 0;
      pBuf[len+2] = 0;
      pCache->iCol = iCol;
      pCache->cacheStatus = cacheStatus;
      pCache->colCacheCtr = colCacheCtr;
      pCache->iOffset = sqlite3BtreeOffset(pC->uc.pCursor);
    }else{
      pBuf = pCache->pCValue;
    }
    assert( t>=12 );
    sqlite3RCStrRef(pBuf);
    if( t&1 ){
      rc = sqlite3VdbeMemSetStr(pDest, pBuf, len, encoding,
                                sqlite3RCStrUnref);
      pDest->flags |= MEM_Term;
    }else{
      rc = sqlite3VdbeMemSetStr(pDest, pBuf, len, 0,
                                sqlite3RCStrUnref);
    }
  }else{
    rc = sqlite3VdbeMemFromBtree(pC->uc.pCursor, iOffset, len, pDest);
    if( rc ) return rc;
    sqlite3VdbeSerialGet((const u8*)pDest->z, t, pDest);
    if( (t&1)!=0 && encoding==SQLITE_UTF8 ){
      pDest->z[len] = 0;
      pDest->flags |= MEM_Term;
    }
  }
  pDest->flags &= ~MEM_Ephem;
  return rc;
}